

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int32 ngram_model_add_word(ngram_model_t *model,char *word,float32 weight)

{
  _func_int32_ngram_model_t_ptr_int32_int32 *p_Var1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  if (model->writable == '\0') {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x291,
            "Can\'t add word \'%s\' to read-only language model. Disable mmap with \'-mmap no\' to make it writable\n"
           );
    uVar4 = 0xffffffff;
  }
  else {
    iVar3 = model->log_zero;
    uVar4 = 0xffffffff;
    uVar2 = ngram_add_word_internal(model,word,-1);
    if (uVar2 != 0xffffffff) {
      if ((model->funcs != (ngram_funcs_s *)0x0) &&
         (p_Var1 = model->funcs->add_ug, p_Var1 != (_func_int32_ngram_model_t_ptr_int32_int32 *)0x0)
         ) {
        iVar3 = logmath_log(model->lmath,(float64)(double)(float)weight);
        iVar3 = (*p_Var1)(model,uVar2,iVar3);
      }
      uVar4 = -(uint)(iVar3 == 0) | uVar2;
    }
  }
  return uVar4;
}

Assistant:

int32
ngram_model_add_word(ngram_model_t * model,
                     const char *word, float32 weight)
{
    int32 wid, prob = model->log_zero;

    /* If we add word to unwritable model, we need to make it writable */
    if (!model->writable) {
        E_WARN("Can't add word '%s' to read-only language model. "
               "Disable mmap with '-mmap no' to make it writable\n", word);
        return -1;
    }

    wid = ngram_add_word_internal(model, word, -1);
    if (wid == NGRAM_INVALID_WID)
        return wid;

    /* Do what needs to be done to add the word to the unigram. */
    if (model->funcs && model->funcs->add_ug)
        prob =
            (*model->funcs->add_ug) (model, wid,
                                     logmath_log(model->lmath, weight));
    if (prob == 0)
        return -1;

    return wid;
}